

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

uint16_t zng_bi_reverse(uint code,int len)

{
  return (uint16_t)
         (((uint)(((ulong)(code & 0xff) * 0x80200802 & 0x884422110) * 0x101010101 >> 0x18) & 0xff00
          | (uint)(((ulong)(code >> 8 & 0xff) * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20) &
            0xff) >> (0x10U - (char)len & 0x1f));
}

Assistant:

Z_INTERNAL uint16_t PREFIX(bi_reverse)(unsigned code, int len) {
    /* code: the value to invert */
    /* len: its bit length */
    Assert(len >= 1 && len <= 15, "code length must be 1-15");
#define bitrev8(b) \
    (uint8_t)((((uint8_t)(b) * 0x80200802ULL) & 0x0884422110ULL) * 0x0101010101ULL >> 32)
    return (bitrev8(code >> 8) | (uint16_t)bitrev8(code) << 8) >> (16 - len);
}